

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_common.c
# Opt level: O1

LY_ERR lysp_stmt_type_enum(lysp_ctx *ctx,lysp_stmt *stmt,lysp_type_enum **enums)

{
  ly_stmt stmt_00;
  long lVar1;
  long lVar2;
  lyd_node *plVar3;
  LY_ERR LVar4;
  LY_ERR LVar5;
  int iVar6;
  undefined8 *puVar7;
  size_t name_len;
  lysp_type_enum *plVar8;
  char *pcVar9;
  char *pcVar10;
  char *format;
  uint32_t substmt_index;
  ly_ctx *plVar11;
  char *in_R8;
  lysp_ext_instance **pplVar12;
  lysp_ext_instance **in_R9;
  lysp_type_enum *plVar13;
  lysp_stmt *stmt_01;
  ulong uVar14;
  bool bVar15;
  
  LVar4 = lysp_stmt_validate_value(ctx,(uint)(stmt->kw == LY_STMT_ENUM) * 2,stmt->arg);
  if (LVar4 != LY_SUCCESS) {
    return LVar4;
  }
  plVar8 = *enums;
  if (plVar8 == (lysp_type_enum *)0x0) {
    puVar7 = (undefined8 *)malloc(0x40);
    if (puVar7 == (undefined8 *)0x0) goto LAB_0016de8b;
    *puVar7 = 1;
  }
  else {
    lVar1 = *(long *)&plVar8[-1].flags;
    *(long *)&plVar8[-1].flags = lVar1 + 1;
    puVar7 = (undefined8 *)realloc(&plVar8[-1].flags,lVar1 * 0x38 + 0x40);
    if (puVar7 == (undefined8 *)0x0) {
      *(long *)&(*enums)[-1].flags = *(long *)&(*enums)[-1].flags + -1;
LAB_0016de8b:
      if (ctx == (lysp_ctx *)0x0) {
        plVar11 = (ly_ctx *)0x0;
      }
      else {
        plVar11 = (ly_ctx *)
                  **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      in_R8 = "lysp_stmt_type_enum";
      bVar15 = false;
      LVar4 = LY_EMEM;
      ly_log(plVar11,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).");
      goto LAB_0016decf;
    }
  }
  *enums = (lysp_type_enum *)(puVar7 + 1);
  bVar15 = true;
  LVar4 = LY_SUCCESS;
LAB_0016decf:
  LVar5 = LVar4;
  if (bVar15) {
    plVar8 = *enums;
    lVar1 = *(long *)&plVar8[-1].flags;
    plVar8[lVar1 + -1].iffeatures = (lysp_qname *)0x0;
    (&plVar8[lVar1 + -1].iffeatures)[1] = (lysp_qname *)0x0;
    plVar8[lVar1 + -1].ref = (char *)0x0;
    (&plVar8[lVar1 + -1].ref)[1] = (char *)0x0;
    plVar8[lVar1 + -1].name = (char *)0x0;
    plVar8[lVar1 + -1].dsc = (char *)0x0;
    *(undefined8 *)&plVar8[lVar1 + -1].flags = 0;
    if (stmt->kw == LY_STMT_ENUM) {
      pcVar9 = stmt->arg;
      name_len = strlen(pcVar9);
      LVar5 = lysp_check_enum_name(ctx,pcVar9,name_len);
      if (LVar5 != LY_SUCCESS) {
        return LVar5;
      }
    }
    if (ctx == (lysp_ctx *)0x0) {
      plVar11 = (ly_ctx *)0x0;
    }
    else {
      plVar11 = (ly_ctx *)
                **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    LVar5 = lydict_insert(plVar11,stmt->arg,0,&plVar8[lVar1 + -1].name);
    if (LVar5 == LY_SUCCESS) {
      plVar13 = *enums;
      if (plVar13 != (lysp_type_enum *)0x0) {
        lVar2 = *(long *)&plVar13[-1].flags;
        bVar15 = lVar2 != 1;
        if (bVar15) {
          pplVar12 = (lysp_ext_instance **)plVar8[lVar1 + -1].name;
          iVar6 = strcmp(plVar13->name,(char *)pplVar12);
          if (iVar6 != 0) {
            uVar14 = 0;
            do {
              plVar13 = plVar13 + 1;
              if (lVar2 - 2U == uVar14) {
                bVar15 = false;
                goto LAB_0016e052;
              }
              iVar6 = strcmp(plVar13->name,(char *)pplVar12);
              uVar14 = uVar14 + 1;
            } while (iVar6 != 0);
            bVar15 = uVar14 < lVar2 - 1U;
          }
          if (ctx == (lysp_ctx *)0x0) {
            plVar11 = (ly_ctx *)0x0;
          }
          else {
            plVar11 = (ly_ctx *)
                      **(undefined8 **)
                        (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
          }
          in_R9 = (lysp_ext_instance **)lyplg_ext_stmt2str(stmt->kw);
          ly_vlog(plVar11,(char *)0x0,LYVE_SYNTAX_YANG,
                  "Duplicate identifier \"%s\" of %s statement.");
          LVar4 = LY_EVALID;
          in_R8 = (char *)pplVar12;
        }
LAB_0016e052:
        if (bVar15) {
          return LVar4;
        }
      }
      stmt_01 = stmt->child;
      if (stmt_01 == (lysp_stmt *)0x0) {
        LVar5 = LY_SUCCESS;
      }
      else {
        plVar8 = plVar8 + lVar1;
        pplVar12 = &plVar8[-1].exts;
        do {
          stmt_00 = stmt_01->kw;
          if (0x22ffff < (int)stmt_00) {
            if ((int)stmt_00 < 0x2c0000) {
              if (stmt_00 == LY_STMT_POSITION) {
                if (stmt->kw != LY_STMT_ENUM) {
LAB_0016e161:
                  in_R8 = (char *)pplVar12;
                  LVar4 = lysp_stmt_type_enum_value_pos
                                    (ctx,stmt_01,&plVar8[-1].value,&plVar8[-1].flags,pplVar12);
                  goto LAB_0016e1b9;
                }
              }
              else {
                substmt_index = (int)plVar8 - 0x28;
                if (stmt_00 == LY_STMT_REFERENCE) goto LAB_0016e1ac;
              }
            }
            else {
              if (stmt_00 == LY_STMT_STATUS) {
                LVar4 = lysp_stmt_status(ctx,stmt_01,&plVar8[-1].flags,pplVar12);
                goto LAB_0016e1b9;
              }
              if ((stmt_00 == LY_STMT_VALUE) && (stmt->kw != LY_STMT_BIT)) goto LAB_0016e161;
            }
LAB_0016e1e2:
            if (ctx == (lysp_ctx *)0x0) {
              plVar11 = (ly_ctx *)0x0;
            }
            else {
              plVar11 = (ly_ctx *)
                        **(undefined8 **)
                          (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
            }
            pcVar9 = lyplg_ext_stmt2str(stmt_00);
            pcVar10 = lyplg_ext_stmt2str(stmt->kw);
            format = "Invalid keyword \"%s\" as a child of \"%s\".";
LAB_0016e259:
            ly_vlog(plVar11,(char *)0x0,LYVE_SYNTAX_YANG,format,pcVar9,pcVar10);
            return LY_EVALID;
          }
          substmt_index = (int)plVar8 - 0x30;
          if (stmt_00 == LY_STMT_DESCRIPTION) {
LAB_0016e1ac:
            in_R8 = (char *)pplVar12;
            LVar4 = lysp_stmt_text_field
                              (ctx,stmt_01,substmt_index,(char **)0x2,(yang_arg)pplVar12,in_R9);
          }
          else if (stmt_00 == LY_STMT_EXTENSION_INSTANCE) {
            in_R8 = (char *)pplVar12;
            LVar4 = lysp_stmt_ext(ctx,stmt_01,stmt->kw,0,pplVar12);
          }
          else {
            if (stmt_00 != LY_STMT_IF_FEATURE) goto LAB_0016e1e2;
            plVar3 = (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
            if (*(byte *)&plVar3[2].schema < 2) {
              if (ctx == (lysp_ctx *)0x0) {
                plVar11 = (ly_ctx *)0x0;
              }
              else {
                plVar11 = (ly_ctx *)**(undefined8 **)plVar3;
              }
              pcVar10 = lyplg_ext_stmt2str(stmt->kw);
              format = 
              "Invalid keyword \"%s\" as a child of \"%s\" - the statement is allowed only in YANG 1.1 modules."
              ;
              pcVar9 = "if-feature";
              goto LAB_0016e259;
            }
            LVar4 = lysp_stmt_qnames(ctx,stmt_01,&plVar8[-1].iffeatures,(yang_arg)pplVar12,
                                     (lysp_ext_instance **)in_R8);
          }
LAB_0016e1b9:
          if (LVar4 != LY_SUCCESS) {
            return LVar4;
          }
          stmt_01 = stmt_01->next;
          LVar5 = LY_SUCCESS;
        } while (stmt_01 != (lysp_stmt *)0x0);
      }
    }
  }
  return LVar5;
}

Assistant:

static LY_ERR
lysp_stmt_type_enum(struct lysp_ctx *ctx, const struct lysp_stmt *stmt, struct lysp_type_enum **enums)
{
    struct lysp_type_enum *enm;

    LY_CHECK_RET(lysp_stmt_validate_value(ctx, stmt->kw == LY_STMT_ENUM ? Y_STR_ARG : Y_IDENTIF_ARG, stmt->arg));

    LY_ARRAY_NEW_RET(PARSER_CTX(ctx), *enums, enm, LY_EMEM);

    if (stmt->kw == LY_STMT_ENUM) {
        LY_CHECK_RET(lysp_check_enum_name(ctx, stmt->arg, strlen(stmt->arg)));
    } /* else nothing specific for YANG_BIT */

    LY_CHECK_RET(lydict_insert(PARSER_CTX(ctx), stmt->arg, 0, &enm->name));
    CHECK_UNIQUENESS(ctx, *enums, name, lyplg_ext_stmt2str(stmt->kw), enm->name);

    for (const struct lysp_stmt *child = stmt->child; child; child = child->next) {
        switch (child->kw) {
        case LY_STMT_DESCRIPTION:
            LY_CHECK_RET(lysp_stmt_text_field(ctx, child, 0, &enm->dsc, Y_STR_ARG, &enm->exts));
            break;
        case LY_STMT_IF_FEATURE:
            PARSER_CHECK_STMTVER2_RET(ctx, "if-feature", lyplg_ext_stmt2str(stmt->kw));
            LY_CHECK_RET(lysp_stmt_qnames(ctx, child, &enm->iffeatures, Y_STR_ARG, &enm->exts));
            break;
        case LY_STMT_REFERENCE:
            LY_CHECK_RET(lysp_stmt_text_field(ctx, child, 0, &enm->ref, Y_STR_ARG, &enm->exts));
            break;
        case LY_STMT_STATUS:
            LY_CHECK_RET(lysp_stmt_status(ctx, child, &enm->flags, &enm->exts));
            break;
        case LY_STMT_VALUE:
            LY_CHECK_ERR_RET(stmt->kw == LY_STMT_BIT, LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(child->kw),
                    lyplg_ext_stmt2str(stmt->kw)), LY_EVALID);
            LY_CHECK_RET(lysp_stmt_type_enum_value_pos(ctx, child, &enm->value, &enm->flags, &enm->exts));
            break;
        case LY_STMT_POSITION:
            LY_CHECK_ERR_RET(stmt->kw == LY_STMT_ENUM, LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(child->kw),
                    lyplg_ext_stmt2str(stmt->kw)), LY_EVALID);
            LY_CHECK_RET(lysp_stmt_type_enum_value_pos(ctx, child, &enm->value, &enm->flags, &enm->exts));
            break;
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(lysp_stmt_ext(ctx, child, stmt->kw, 0, &enm->exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(child->kw), lyplg_ext_stmt2str(stmt->kw));
            return LY_EVALID;
        }
    }

    return LY_SUCCESS;
}